

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

bool __thiscall ConstTpl::operator<(ConstTpl *this,ConstTpl *op2)

{
  const_type cVar1;
  const_type cVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  cVar2 = this->type;
  cVar1 = op2->type;
  bVar6 = SBORROW4(cVar2,cVar1);
  bVar5 = (int)(cVar2 - cVar1) < 0;
  if (cVar2 != cVar1) {
LAB_0033beac:
    return bVar6 != bVar5;
  }
  if (cVar2 == spaceid) {
    bVar5 = (this->value).spaceid < (op2->value).spaceid;
  }
  else {
    if (cVar2 == handle) {
      iVar3 = (op2->value).handle_index;
      iVar4 = (this->value).handle_index;
      bVar6 = SBORROW4(iVar4,iVar3);
      bVar5 = iVar4 - iVar3 < 0;
      if (iVar4 == iVar3) {
        bVar6 = SBORROW4(this->select,op2->select);
        bVar5 = (int)(this->select - op2->select) < 0;
      }
      goto LAB_0033beac;
    }
    if (cVar2 != real) {
      return false;
    }
    bVar5 = this->value_real < op2->value_real;
  }
  return bVar5;
}

Assistant:

bool ConstTpl::operator<(const ConstTpl &op2) const

{
  if (type != op2.type) return (type < op2.type);
  switch(type) {
  case real:
    return (value_real < op2.value_real);
  case handle:
    if (value.handle_index != op2.value.handle_index)
      return (value.handle_index < op2.value.handle_index);
    if (select != op2.select) return (select < op2.select);
    break;
  case spaceid:
    return (value.spaceid < op2.value.spaceid);
  default:			// Nothing additional to compare
    break;
  }
  return false;
}